

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer.cpp
# Opt level: O3

void __thiscall
duckdb::UndoBuffer::Commit(UndoBuffer *this,IteratorState *iterator_state,transaction_t commit_id)

{
  optional_ptr<duckdb::UndoBufferEntry,_true> *this_00;
  UndoFlags type;
  UndoFlags UVar1;
  UndoBufferEntry *pUVar2;
  BufferManager *pBVar3;
  data_ptr_t pdVar4;
  UndoFlags *pUVar5;
  UndoFlags *pUVar6;
  CommitState state;
  CommitState local_58;
  BufferHandle local_48;
  
  CommitState::CommitState(&local_58,this->transaction,commit_id);
  pUVar2 = (this->allocator).tail.ptr;
  (iterator_state->current).ptr = pUVar2;
  if (pUVar2 != (UndoBufferEntry *)0x0) {
    this_00 = &iterator_state->current;
    do {
      pBVar3 = (this->allocator).buffer_manager;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(this_00);
      (*pBVar3->_vptr_BufferManager[7])(&local_48,pBVar3,&((iterator_state->current).ptr)->block);
      BufferHandle::operator=(&iterator_state->handle,&local_48);
      BufferHandle::~BufferHandle(&local_48);
      optional_ptr<duckdb::FileBuffer,_true>::CheckValid(&(iterator_state->handle).node);
      pdVar4 = ((iterator_state->handle).node.ptr)->buffer;
      iterator_state->start = pdVar4;
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(this_00);
      pUVar6 = (UndoFlags *)iterator_state->start;
      pUVar5 = (UndoFlags *)(pdVar4 + ((iterator_state->current).ptr)->position);
      iterator_state->end = (data_ptr_t)pUVar5;
      if (pUVar6 < pUVar5) {
        do {
          type = *pUVar6;
          iterator_state->start = (data_ptr_t)(pUVar6 + 1);
          UVar1 = pUVar6[1];
          iterator_state->start = (data_ptr_t)(pUVar6 + 2);
          CommitState::CommitEntry(&local_58,type,(data_ptr_t)(pUVar6 + 2));
          pUVar6 = (UndoFlags *)(iterator_state->start + UVar1);
          iterator_state->start = (data_ptr_t)pUVar6;
        } while (pUVar6 < iterator_state->end);
      }
      optional_ptr<duckdb::UndoBufferEntry,_true>::CheckValid(this_00);
      pUVar2 = (this_00->ptr->prev).ptr;
      this_00->ptr = pUVar2;
    } while (pUVar2 != (UndoBufferEntry *)0x0);
  }
  return;
}

Assistant:

void UndoBuffer::Commit(UndoBuffer::IteratorState &iterator_state, transaction_t commit_id) {
	CommitState state(transaction, commit_id);
	IterateEntries(iterator_state, [&](UndoFlags type, data_ptr_t data) { state.CommitEntry(type, data); });
}